

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void sse::RgbToBgr(uint8_t *outY,uint8_t *inY,uint8_t *outYEnd,uint32_t rowSizeOut,
                  uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,uint32_t totalSimdWidth,
                  uint32_t nonSimdWidth)

{
  uint8_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint8_t *puVar4;
  undefined7 in_register_00000089;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  
  auVar3 = _DAT_00165d20;
  puVar7 = inY + 2;
  uVar5 = CONCAT71(in_register_00000089,colorCount) & 0xffffffff;
  puVar4 = outY + (ulong)totalSimdWidth + 2;
  for (; outY != outYEnd; outY = outY + rowSizeOut) {
    puVar8 = puVar7;
    for (uVar6 = 0; totalSimdWidth != uVar6; uVar6 = uVar6 + simdWidth) {
      puVar8 = puVar8 + simdWidth;
      auVar2 = vpshufb_avx(*(undefined1 (*) [16])(inY + uVar6),auVar3);
      *(undefined1 (*) [16])(outY + uVar6) = auVar2;
    }
    if (nonSimdWidth != 0) {
      for (uVar6 = 0; nonSimdWidth != uVar6; uVar6 = uVar6 + uVar5) {
        puVar4[uVar6] = puVar8[-2];
        puVar4[uVar6 - 1] = puVar8[-1];
        uVar1 = *puVar8;
        puVar8 = puVar8 + uVar5;
        puVar4[uVar6 - 2] = uVar1;
      }
    }
    inY = inY + rowSizeIn;
    puVar4 = puVar4 + rowSizeOut;
    puVar7 = puVar7 + rowSizeIn;
  }
  return;
}

Assistant:

void RgbToBgr( uint8_t * outY, const uint8_t * inY, const uint8_t * outYEnd, uint32_t rowSizeOut, uint32_t rowSizeIn, 
                   const uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl = _mm_set_epi8(15, 12, 13, 14, 9, 10, 11, 6, 7, 8, 3, 4, 5, 0, 1, 2);
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + totalSimdWidth;

            for( ; outX != outXEnd; outX += simdWidth, inX += simdWidth ) {
                const simd * src = reinterpret_cast<const simd*> (inX);
                simd * dst = reinterpret_cast<simd*> (outX);
                simd result = _mm_loadu_si128( src );
                result = _mm_shuffle_epi8( result, ctrl );
                _mm_storeu_si128( dst, result );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * outXEndNonSimd = outXEnd + nonSimdWidth;
                for( ; outX != outXEndNonSimd; outX += colorCount, inX += colorCount ) {
                    *(outX + 2) = *(inX);
                    *(outX + 1) = *(inX + 1);
                    *(outX) = *(inX + 2);
                }
            }
        }
    }